

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroup::AddColumn
          (RowGroup *this,RowGroupCollection *new_collection,ColumnDefinition *new_column,
          ExpressionExecutor *executor,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  BlockManager *block_manager;
  BlockManager *start_row;
  element_type *peVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 this_00;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> uVar5;
  RowVersionManager *__tmp;
  type info;
  LogicalType *type;
  ColumnData *pCVar6;
  RowGroup *this_01;
  pointer pRVar7;
  element_type *peVar8;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  *__x;
  idx_t i;
  ulong uVar9;
  Vector *in_R9;
  ulong uVar10;
  idx_t iVar11;
  shared_ptr<duckdb::ColumnData,_true> added_column;
  templated_unique_single_t *row_group;
  ColumnAppendState state;
  DataChunk dummy_chunk;
  undefined1 local_d8 [56];
  ColumnAppendState local_a0;
  DataChunk local_70;
  
  p_Var1 = (new_collection->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  block_manager = (BlockManager *)p_Var1->_vptr__Sp_counted_base;
  local_d8._32_8_ = new_column;
  local_d8._40_8_ = this;
  local_d8._48_8_ = result;
  info = shared_ptr<duckdb::DataTableInfo,_true>::operator*
                   ((shared_ptr<duckdb::DataTableInfo,_true> *)&p_Var1[1]._M_use_count);
  start_row = new_collection->block_manager;
  peVar2 = (new_collection->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupSegmentTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar11 = new_collection->row_start;
  type = ColumnDefinition::Type((ColumnDefinition *)executor);
  ColumnData::CreateColumn
            ((ColumnData *)local_d8,block_manager,info,(long)((long)peVar2 - iVar11) >> 4,
             (idx_t)start_row,type,(optional_ptr<duckdb::ColumnData,_true>)0x0);
  uVar3 = new_collection->row_group_size;
  if (uVar3 != 0) {
    DataChunk::DataChunk(&local_70);
    local_a0.child_appends.
    super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
    super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.lock.
    super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
    super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
    super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
          )0x0;
    local_a0.child_appends.
    super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
    super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.child_appends.
    super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
    super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.append_state.
    super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
    .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
          )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
            )0x0;
    pCVar6 = shared_ptr<duckdb::ColumnData,_true>::operator->
                       ((shared_ptr<duckdb::ColumnData,_true> *)local_d8);
    (*pCVar6->_vptr_ColumnData[0x11])(pCVar6,&local_a0);
    uVar9 = 0;
    uVar10 = uVar3;
    do {
      iVar11 = 0x800;
      if (uVar10 < 0x800) {
        iVar11 = uVar10;
      }
      local_70.count = iVar11;
      ExpressionExecutor::ExecuteExpression((ExpressionExecutor *)local_d8._48_8_,&local_70,in_R9);
      pCVar6 = shared_ptr<duckdb::ColumnData,_true>::operator->
                         ((shared_ptr<duckdb::ColumnData,_true> *)local_d8);
      ColumnData::Append(pCVar6,&local_a0,in_R9,iVar11);
      uVar9 = uVar9 + 0x800;
      uVar10 = uVar10 - 0x800;
    } while (uVar9 < uVar3);
    if (local_a0.append_state.
        super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
        .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_a0.append_state.
          super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
          .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl)[1])();
    }
    uVar5.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
    _M_t.super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
    super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         local_a0.lock;
    local_a0.append_state.
    super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
    .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
          )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
            )0x0;
    if ((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
        local_a0.lock.
        super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
        super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
        .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)0x0)
    {
      StorageLockKey::~StorageLockKey
                ((StorageLockKey *)
                 local_a0.lock.
                 super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
                 .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
      operator_delete((void *)uVar5.
                              super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
                              .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
    }
    local_a0.lock.
    super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
    super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
    super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
          )0x0;
    ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::~vector
              (&local_a0.child_appends.
                super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>)
    ;
    DataChunk::~DataChunk(&local_70);
  }
  this_01 = (RowGroup *)operator_new(200);
  RowGroup(this_01,(RowGroupCollection *)local_d8._32_8_,(idx_t)new_collection->block_manager,
           new_collection->row_group_size);
  this_00 = local_d8._40_8_;
  *(RowGroup **)local_d8._40_8_ = this_01;
  pRVar7 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      local_d8._40_8_);
  GetOrCreateVersionInfoPtr((RowGroup *)(local_d8 + 0x10));
  uVar4 = local_d8._24_8_;
  peVar8 = (element_type *)local_d8._16_8_;
  local_d8._16_8_ = 0;
  local_d8._24_8_ = (BlockManager *)0x0;
  (pRVar7->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
  p_Var1 = (pRVar7->owned_version_info).internal.
           super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (pRVar7->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    peVar8 = (pRVar7->owned_version_info).internal.
             super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  LOCK();
  (pRVar7->version_info)._M_i.ptr = peVar8;
  UNLOCK();
  __x = &GetColumns((RowGroup *)new_collection)->
         super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  ;
  pRVar7 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this_00);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  ::operator=(&(pRVar7->columns).
               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              ,__x);
  pRVar7 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this_00);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
            ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
              *)&pRVar7->columns,(shared_ptr<duckdb::ColumnData,_true> *)local_d8);
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (_Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>)this_00;
}

Assistant:

unique_ptr<RowGroup> RowGroup::AddColumn(RowGroupCollection &new_collection, ColumnDefinition &new_column,
                                         ExpressionExecutor &executor, Vector &result) {
	Verify();

	// construct a new column data for the new column
	auto added_column =
	    ColumnData::CreateColumn(GetBlockManager(), GetTableInfo(), GetColumnCount(), start, new_column.Type());

	idx_t rows_to_write = this->count;
	if (rows_to_write > 0) {
		DataChunk dummy_chunk;

		ColumnAppendState state;
		added_column->InitializeAppend(state);
		for (idx_t i = 0; i < rows_to_write; i += STANDARD_VECTOR_SIZE) {
			idx_t rows_in_this_vector = MinValue<idx_t>(rows_to_write - i, STANDARD_VECTOR_SIZE);
			dummy_chunk.SetCardinality(rows_in_this_vector);
			executor.ExecuteExpression(dummy_chunk, result);
			added_column->Append(state, result, rows_in_this_vector);
		}
	}

	// set up the row_group based on this row_group
	auto row_group = make_uniq<RowGroup>(new_collection, this->start, this->count);
	row_group->SetVersionInfo(GetOrCreateVersionInfoPtr());
	row_group->columns = GetColumns();
	// now add the new column
	row_group->columns.push_back(std::move(added_column));

	row_group->Verify();
	return row_group;
}